

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

Matrix<double,_2,_2> *
gl4cts::Math::cofactors<2>
          (Matrix<double,_2,_2> *__return_storage_ptr__,Matrix<double,_2,_2> *matrix)

{
  double *pdVar1;
  double local_60;
  GLdouble minor_value;
  uint local_20;
  GLuint r;
  GLuint c;
  Matrix<double,_2,_2> *matrix_local;
  Matrix<double,_2,_2> *result;
  
  tcu::Matrix<double,_2,_2>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    for (minor_value._4_4_ = 0; minor_value._4_4_ < 2; minor_value._4_4_ = minor_value._4_4_ + 1) {
      local_60 = minor_impl<2>(matrix,local_20,minor_value._4_4_);
      if ((local_20 + minor_value._4_4_ & 1) == 1) {
        local_60 = -local_60;
      }
      pdVar1 = tcu::Matrix<double,_2,_2>::operator()
                         (__return_storage_ptr__,minor_value._4_4_,local_20);
      *pdVar1 = local_60;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::Matrix<glw::GLdouble, Size, Size> cofactors(const tcu::Matrix<glw::GLdouble, Size, Size>& matrix)
{
	tcu::Matrix<glw::GLdouble, Size, Size> result;

	for (glw::GLuint c = 0; c < Size; ++c)
	{
		for (glw::GLuint r = 0; r < Size; ++r)
		{
			const glw::GLdouble minor_value = minor_impl(matrix, c, r);

			result(r, c) = (1 == (c + r) % 2) ? -minor_value : minor_value;
		}
	}

	return result;
}